

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_main.c
# Opt level: O2

int cmdUsage(void)

{
  char *str;
  size_t sVar1;
  char **ppcVar2;
  cmd_entry_t *pcVar3;
  ulong uVar4;
  
  printf("Usage:\n  bee2cmd {");
  pcVar3 = _cmds;
  for (uVar4 = 1; uVar4 < _count; uVar4 = uVar4 + 1) {
    printf("%s|",pcVar3->name);
    pcVar3 = pcVar3 + 1;
  }
  printf("%s} ...\n",pcVar3->name);
  ppcVar2 = &_cmds[0].descr;
  for (uVar4 = 0; uVar4 < _count; uVar4 = uVar4 + 1) {
    str = ((cmd_entry_t *)(ppcVar2 + -1))->name;
    sVar1 = strLen(str);
    printf("    %s%*s%s\n",str,(ulong)(0xc - (int)sVar1),"",*ppcVar2);
    ppcVar2 = ppcVar2 + 3;
  }
  return -1;
}

Assistant:

int cmdUsage()
{
	size_t pos;
	// перечень команд
	printf(
		"Usage:\n"
		"  bee2cmd {");
	for (pos = 0; pos + 1 < _count; ++pos)
		printf("%s|", _cmds[pos].name);
	printf("%s} ...\n", _cmds[pos].name);
	// краткая справка по каждой команде
	for (pos = 0; pos < _count; ++pos)
		printf("    %s%*s%s\n",
			_cmds[pos].name,
			(int)(12 - strLen(_cmds[pos].name)), "",
			_cmds[pos].descr);
	return -1;
}